

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O1

void reset_game(void)

{
  undefined4 uVar1;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Am_Object(&local_10,&anim);
  Am_Object::Am_Object(&local_18,(Am_Object *)&Am_No_Object);
  uVar1 = _Am_Default_Stop_Char;
  Am_Object::Am_Object(&local_20,(Am_Object *)&Am_No_Object);
  Am_Stop_Interactor(&local_10,&local_18,uVar1,&local_20,0,0,1);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Set(0x82e0,true,0);
  Am_Object::Set(0x82e8,true,1);
  return;
}

Assistant:

void
reset_game()
{
  Am_Stop_Interactor(anim);
  ball.Set(Am_VISIBLE, false);
  start_button.Set(Am_VISIBLE, true);
}